

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  SessionHandle *pSVar2;
  connectdata *conn_00;
  ushort uVar3;
  unsigned_short uVar4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  if2ip_result_t iVar8;
  CURLcode error;
  char *pcVar9;
  char *__dest;
  char *__s;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  long lVar14;
  uint uVar15;
  ftpport fVar16;
  char cVar17;
  uint uVar18;
  Curl_addrinfo *ai;
  bool bVar19;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  curl_socket_t local_a04;
  SessionHandle *local_a00;
  socklen_t local_9f8;
  undefined4 local_9f4;
  uint local_9f0;
  undefined4 local_9ec;
  connectdata *local_9e8;
  uint local_9dc;
  undefined4 local_9d8;
  ftpport local_9d4;
  pingpong *local_9d0;
  ulong local_9c8;
  Curl_dns_entry *local_9c0;
  sockaddr local_9b8 [8];
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  pSVar2 = conn->data;
  local_a04 = -1;
  pcVar9 = (char *)memset(local_938,0,0x100);
  pcVar12 = (pSVar2->set).str[9];
  local_9c0 = (Curl_dns_entry *)0x0;
  local_a00 = pSVar2;
  local_9d4 = fcmd;
  if ((pcVar12 == (char *)0x0) || (pcVar9 = (char *)strlen(pcVar12), pcVar9 < (char *)0x2)) {
    pcVar11 = (char *)0x0;
    uVar15 = 0;
    local_9f4 = 0;
    __dest = (char *)0x0;
  }
  else {
    pcVar11 = (char *)0x11;
    if ((char *)0xf < pcVar9) {
      pcVar11 = pcVar9 + 1;
    }
    __dest = (char *)(*Curl_ccalloc)((size_t)pcVar11,1);
    if (__dest == (char *)0x0) {
      __s = (char *)0x1b;
      uVar15 = 0;
      local_9f4 = 0;
      pcVar9 = (char *)0x0;
LAB_004d87e5:
      bVar19 = false;
      pcVar11 = (char *)0x0;
    }
    else {
      __s = pcVar12;
      if (*pcVar12 != ':') {
        __s = strchr(pcVar12,0x3a);
        if (__s == (char *)0x0) {
          strcpy(__dest,pcVar12);
          __s = (char *)0x0;
        }
        else {
          strncpy(__dest,pcVar12,(long)__s - (long)pcVar12);
        }
      }
      if ((__s == (char *)0x0) || (pcVar12 = strchr(__s,0x3a), pcVar12 == (char *)0x0)) {
        uVar18 = 0;
        uVar7 = 0;
      }
      else {
        uVar13 = strtoul(pcVar12 + 1,(char **)0x0,10);
        uVar4 = curlx_ultous(uVar13);
        uVar18 = (uint)CONCAT62(extraout_var,uVar4);
        pcVar12 = strchr(pcVar12,0x2d);
        uVar7 = uVar18;
        if (pcVar12 != (char *)0x0) {
          uVar13 = strtoul(pcVar12 + 1,(char **)0x0,10);
          uVar4 = curlx_ultous(uVar13);
          uVar7 = (uint)CONCAT62(extraout_var_00,uVar4);
        }
      }
      uVar15 = uVar18;
      if ((ushort)uVar7 < (ushort)uVar18) {
        uVar15 = 0;
      }
      pcVar9 = (char *)(ulong)uVar7;
      if ((ushort)uVar7 < (ushort)uVar18) {
        pcVar9 = (char *)0x0;
      }
      local_9f4 = SUB84(pcVar9,0);
      bVar19 = true;
      pcVar11 = (char *)0x0;
      if (*__dest != '\0') {
        iVar8 = Curl_if2ip(conn->ip_addr->ai_family,conn->scope,__dest,local_438,0x401);
        pcVar9 = (char *)(ulong)iVar8;
        pcVar11 = local_438;
        if (iVar8 != IF2IP_FOUND) {
          if (iVar8 == IF2IP_AF_NOT_SUPPORTED) {
            __s = (char *)0x1e;
            goto LAB_004d87e5;
          }
          pcVar11 = __dest;
          if (iVar8 != IF2IP_NOT_FOUND) {
            pcVar11 = (char *)0x0;
          }
        }
      }
    }
    pcVar12 = __s;
    if (!bVar19) {
      return (CURLcode)__s;
    }
  }
  local_9ec = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),pcVar11 != (char *)0x0);
  if (pcVar11 == (char *)0x0) {
    local_9f8 = 0x80;
    iVar6 = getsockname(conn->sock[0],local_9b8,&local_9f8);
    if (iVar6 != 0) {
      piVar10 = __errno_location();
      pcVar11 = Curl_strerror(conn,*piVar10);
      pcVar12 = "getsockname() failed: %s";
      goto LAB_004d84fd;
    }
    pcVar11 = local_438;
    Curl_inet_ntop((uint)local_9b8[0].sa_family,local_9b8[0].sa_data + 2,pcVar11,0x401);
  }
  local_9d8 = SUB84(pcVar12,0);
  ai = (Curl_addrinfo *)0x0;
  Curl_resolv(conn,pcVar11,0,&local_9c0);
  if (local_9c0 != (Curl_dns_entry *)0x0) {
    ai = local_9c0->addr;
    Curl_resolv_unlock(local_a00,local_9c0);
  }
  if (ai != (Curl_addrinfo *)0x0) {
    if (__dest != (char *)0x0) {
      (*Curl_cfree)(__dest);
    }
    local_a04 = -1;
    iVar6 = 0;
    local_9f0 = uVar15;
    local_9e8 = conn;
    CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&local_a04);
    if (CVar5 == CURLE_OK) {
      bVar19 = false;
      uVar13 = 0;
    }
    else {
      piVar10 = __errno_location();
      do {
        uVar13 = (ulong)CVar5;
        iVar6 = *piVar10;
        ai = ai->ai_next;
        bVar19 = ai == (Curl_addrinfo *)0x0;
        if (bVar19) break;
        uVar13 = 0;
        CVar5 = Curl_socket(local_9e8,ai,(Curl_sockaddr_ex *)0x0,&local_a04);
      } while (CVar5 != CURLE_OK);
    }
    local_9c8 = uVar13;
    if (bVar19) {
      pcVar12 = Curl_strerror(local_9e8,iVar6);
      Curl_failf(local_a00,"socket failure: %s",pcVar12);
    }
    else {
      memcpy(local_9b8,ai->ai_addr,(ulong)ai->ai_addrlen);
      conn_00 = local_9e8;
      local_9f8 = ai->ai_addrlen;
      uVar3 = (ushort)local_9f4;
      if (uVar3 < (ushort)local_9f0) {
LAB_004d8586:
        Curl_failf(local_a00,"bind() failed, we ran out of ports!");
      }
      else {
        local_9d0 = (pingpong *)&local_9e8->proto;
        do {
          bVar19 = false;
          uVar15 = local_9f0;
          while( true ) {
            if (local_9b8[0].sa_family == 2) {
              local_9b8[0].sa_data._0_2_ = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
            }
            iVar6 = bind(local_a04,local_9b8,local_9f8);
            if (iVar6 == 0) {
              if (bVar19) goto LAB_004d8586;
              local_9f8 = 0x80;
              iVar6 = getsockname(local_a04,local_9b8,&local_9f8);
              if (iVar6 != 0) {
                piVar10 = __errno_location();
                iVar6 = *piVar10;
                goto LAB_004d86f8;
              }
              iVar6 = listen(local_a04,1);
              if (iVar6 != 0) {
                piVar10 = __errno_location();
                pcVar12 = Curl_strerror(conn_00,*piVar10);
                pcVar9 = "socket failure: %s";
                goto LAB_004d8860;
              }
              Curl_printable_address(ai,local_938,0x100);
              CVar5 = (CURLcode)local_9c8;
              fVar16 = local_9d4;
              if (local_9d4 == DONE) goto LAB_004d88d6;
              goto LAB_004d88af;
            }
            piVar10 = __errno_location();
            iVar6 = *piVar10;
            if ((iVar6 == 99 & (byte)local_9ec) == 1) break;
            if ((iVar6 != 0xd) && (iVar6 != 0x62)) {
              pcVar12 = Curl_strerror(conn_00,iVar6);
              Curl_failf(local_a00,"bind(port=%hu) failed: %s",(ulong)(uVar15 & 0xffff),pcVar12);
              goto LAB_004d8599;
            }
            uVar15 = uVar15 + 1;
            bVar19 = uVar3 < (ushort)uVar15;
            if (uVar3 < (ushort)uVar15) goto LAB_004d8586;
          }
          local_9dc = uVar15 & 0xffff;
          pcVar12 = Curl_strerror(conn_00,99);
          local_9ec = 0;
          Curl_infof(local_a00,"bind(port=%hu) on non-local address failed: %s\n",(ulong)local_9dc,
                     pcVar12);
          local_9f8 = 0x80;
          iVar6 = getsockname(conn_00->sock[0],local_9b8,&local_9f8);
        } while (iVar6 == 0);
        iVar6 = *piVar10;
LAB_004d86f8:
        pcVar12 = Curl_strerror(conn_00,iVar6);
        pcVar9 = "getsockname() failed: %s";
LAB_004d8860:
        Curl_failf(local_a00,pcVar9,pcVar12);
      }
LAB_004d8599:
      Curl_closesocket(conn_00,local_a04);
    }
    return CURLE_FTP_PORT_FAILED;
  }
  pcVar12 = "failed to resolve the address provided to PORT: %s";
LAB_004d84fd:
  Curl_failf(local_a00,pcVar12,pcVar11);
  if (__dest != (char *)0x0) {
    (*Curl_cfree)(__dest);
  }
  return CURLE_FTP_PORT_FAILED;
LAB_004d88af:
  do {
    if (((fVar16 != EPRT) || ((conn_00->bits).ftp_use_eprt != false)) &&
       (local_9b8[0].sa_family == 2)) {
      if (fVar16 == EPRT) {
        CVar5 = CURLE_OK;
        error = Curl_pp_sendf(local_9d0,"%s |%d|%s|%hu|",ftp_state_use_port::mode,1,local_938,
                              (ulong)(ushort)(local_9b8[0].sa_data._0_2_ << 8 |
                                             (ushort)local_9b8[0].sa_data._0_2_ >> 8));
        if (error != CURLE_OK) {
          pcVar12 = curl_easy_strerror(error);
          Curl_failf(local_a00,"Failure sending EPRT command: %s",pcVar12);
          Curl_closesocket(conn_00,local_a04);
          (conn_00->proto).ftpc.count1 = 1;
          (conn_00->proto).ftpc.state = FTP_STOP;
          return error;
        }
        goto LAB_004d88d6;
      }
      if (fVar16 == PORT) {
        lVar14 = 0;
        while( true ) {
          cVar1 = local_938[lVar14];
          cVar17 = ',';
          if ((cVar1 != '.') && (cVar17 = cVar1, cVar1 == '\0')) break;
          local_838[lVar14] = cVar17;
          lVar14 = lVar14 + 1;
        }
        local_838[lVar14] = '\0';
        curl_msnprintf(local_838 + lVar14,0x14,",%d,%d",(ulong)(local_9b8[0].sa_data._0_2_ & 0xff),
                       (ulong)SUB21(local_9b8[0].sa_data._0_2_,1));
        CVar5 = Curl_pp_sendf(local_9d0,"%s %s",0x53c735,local_838);
        if (CVar5 != CURLE_OK) {
          pcVar12 = curl_easy_strerror(CVar5);
          Curl_failf(local_a00,"Failure sending PORT command: %s",pcVar12);
          Curl_closesocket(conn_00,local_a04);
          (conn_00->proto).ftpc.state = FTP_STOP;
          return CVar5;
        }
        goto LAB_004d88d6;
      }
    }
    fVar16 = fVar16 + PORT;
  } while (fVar16 != DONE);
  fVar16 = DONE;
LAB_004d88d6:
  (conn_00->proto).ftpc.count1 = fVar16;
  if (conn_00->sock[1] != -1) {
    Curl_closesocket(conn_00,conn_00->sock[1]);
  }
  conn_00->sock[1] = local_a04;
  (conn_00->bits).tcpconnect[1] = true;
  (conn_00->proto).ftpc.state = FTP_PORT;
  return CVar5;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct SessionHandle *data=conn->data;
  curl_socket_t portsock= CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa=(struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h=NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen+1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      if((ip_end = strchr(string_ftpport, ']')) != NULL )
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
    }
    else if((ip_end = strchr(string_ftpport, ':')) != NULL) {
        /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
      if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
        /* ipv6 */
        port_min = port_max = 0;
        strcpy(addr, string_ftpport);
        ip_end = NULL; /* this got no port ! */
      }
      else
#endif
        /* (ipv4|domain|interface):port(-range) */
        strncpy(addr, string_ftpport, ip_end - ip_start );
    }
    else
      /* ipv4|interface */
      strcpy(addr, string_ftpport);

    /* parse the port */
    if(ip_end != NULL) {
      if((port_start = strchr(ip_end, ':')) != NULL) {
        port_min = curlx_ultous(strtoul(port_start+1, NULL, 10));
        if((port_sep = strchr(port_start, '-')) != NULL) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711 , in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max )
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family, conn->scope, addr,
                     hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      Curl_safefree(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    Curl_safefree(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  Curl_safefree(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      else if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is ipv4 only */
      continue;

    switch (sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    else if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest=',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}